

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
PS2KeyboardSimulationDataGenerator::HostSendByte
          (PS2KeyboardSimulationDataGenerator *this,U8 payload)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = (int)this + 0x10;
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mClock);
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mClock);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByTimeS(0.000125);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  iVar2 = 8;
  do {
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(2.0);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 8;
  do {
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(0.001);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  return;
}

Assistant:

void PS2KeyboardSimulationDataGenerator::HostSendByte( U8 payload )
{
    // make a copy of the data for calculating parity bit later
    U8 copyofpayload = payload;

    // start bit
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mClock->TransitionIfNeeded( BIT_HIGH );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

    // bring the clock low for at least 100 microseconds
    mClock->TransitionIfNeeded( BIT_LOW );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );
    mData->TransitionIfNeeded( BIT_LOW );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( .000125 ) );

    // data, lsb first
    for( int i = 0; i < 8; i++ )
    {
        mClock->Transition();
        mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

        if( payload & 0x01 )
        {
            mData->TransitionIfNeeded( BIT_HIGH );
            payload = payload >> 1;
        }
        else
        {
            mData->TransitionIfNeeded( BIT_LOW );
            payload = payload >> 1;
        }

        mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

        mClock->Transition();
        mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );
    }
    // parity bit
    int ones = 0;

    // sum the ones
    for( U32 j = 0; j < 8; j++ )
    {
        ones = ones + ( copyofpayload & 0x01 );
        copyofpayload = copyofpayload >> 1;
    }

    // if lsb of ones is 1, then there is an odd number of ones, therefore parity =0
    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    if( ones & 0x01 )
        mData->TransitionIfNeeded( BIT_LOW );
    else
        mData->TransitionIfNeeded( BIT_HIGH );


    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );


    // stop bit
    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mData->TransitionIfNeeded( BIT_HIGH );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    // simulate the ACK
    mData->TransitionIfNeeded( BIT_LOW );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    // data line idle state is BIT_HIGH
    mData->TransitionIfNeeded( BIT_HIGH );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );
    mClock->Transition();

    // advance to the next time of transmission
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( .001 ) );
}